

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::WriteAttributeToMemory
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,char *name,char *type,
               uchar *data,int len)

{
  uchar *__first;
  char *pcVar1;
  size_t sVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  const_iterator local_88;
  uchar *local_80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  const_iterator local_70;
  int local_64;
  iterator iStack_60;
  int outLen;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  const_iterator local_50;
  uchar *local_48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  const_iterator local_38;
  int local_2c;
  uchar *puStack_28;
  int len_local;
  uchar *data_local;
  char *type_local;
  char *name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  local_2c = len;
  puStack_28 = data;
  data_local = (uchar *)type;
  type_local = name;
  name_local = (char *)out;
  local_40._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(out);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_38,&local_40);
  pcVar1 = type_local;
  sVar2 = strlen(type_local);
  local_48 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<char_const*,void>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,local_38
                                 ,pcVar1,pcVar1 + sVar2 + 1);
  pcVar1 = name_local;
  local_58._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)name_local);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_50,&local_58);
  __first = data_local;
  sVar2 = strlen((char *)data_local);
  iStack_60 = std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)pcVar1,local_50,
                         __first,__first + sVar2 + 1);
  local_64 = local_2c;
  swap4(&local_64);
  pcVar1 = name_local;
  local_78._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)name_local);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_70,&local_78);
  local_80 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      insert<unsigned_char*,void>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)pcVar1,
                                 local_70,(uchar *)&local_64,(uchar *)&stack0xffffffffffffffa0);
  pcVar1 = name_local;
  local_90._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)name_local);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_88,&local_90);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)pcVar1,local_88,puStack_28,
             puStack_28 + local_2c);
  return;
}

Assistant:

static void WriteAttributeToMemory(std::vector<unsigned char> *out,
                                   const char *name, const char *type,
                                   const unsigned char *data, int len) {
  out->insert(out->end(), name, name + strlen(name) + 1);
  out->insert(out->end(), type, type + strlen(type) + 1);

  int outLen = len;
  tinyexr::swap4(&outLen);
  out->insert(out->end(), reinterpret_cast<unsigned char *>(&outLen),
              reinterpret_cast<unsigned char *>(&outLen) + sizeof(int));
  out->insert(out->end(), data, data + len);
}